

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comServer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  ErrorCode result;
  SmartPtr<IFoo> foo;
  SmartPtr<IFooService> service;
  ErrorCode local_4c;
  CID local_48;
  long *local_40;
  IID local_38;
  CID local_30;
  GetServiceHelper local_28;
  
  plVar1 = (long *)JHCOM::getComponentManager();
  local_4c = (**(code **)(*plVar1 + 0x28))(plVar1,"libfooservice.so");
  if (local_4c == kNoError) {
    local_28.mCid = &local_48;
    local_48.mId = "FooService";
    local_28.super_SmartPtrHelper._vptr_SmartPtrHelper = (_func_int **)&PTR_operator___00103d18;
    local_28.mFatal = false;
    local_40 = (long *)0x0;
    local_38.mId = "IFooService";
    local_28.mError = &local_4c;
    JHCOM::GetServiceHelper::operator()(&local_28,&local_38,&local_40);
    if (local_4c == kNoError) {
      (**(code **)(*local_40 + 0x28))();
    }
    else {
      jh_log_print(2,"int main(int, char **)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                   ,0x37,"Failed to get service %d");
    }
    local_28.mCid = &local_30;
    local_30.mId = "FooFactory";
    local_28.super_SmartPtrHelper._vptr_SmartPtrHelper = (_func_int **)&PTR_operator___00103d68;
    local_28.mFatal = false;
    local_48.mId = (char *)0x0;
    local_38.mId = "IFoo";
    local_28.mError = &local_4c;
    JHCOM::CreateInstanceHelper::operator()
              ((CreateInstanceHelper *)&local_28,&local_38,&local_48.mId);
    if (local_4c == kNoError) {
      (**(code **)(*(long *)local_48.mId + 0x28))();
    }
    else {
      jh_log_print(2,"int main(int, char **)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                   ,0x3e,"Failed to get service %d");
    }
    if ((long *)local_48.mId != (long *)0x0) {
      (**(code **)(*(long *)local_48.mId + 8))();
    }
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
  }
  else {
    jh_log_print(2,"int main(int, char **)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                 ,0x2e,"Failed to fail library %d",local_4c);
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
	IComponentManager *mgr = getComponentManager();
	ErrorCode result;
	
	result = mgr->LoadLibrary( "libfooservice.so" );

	if ( result != kNoError )
	{
		LOG_WARN( "Failed to fail library %d", result );
		return 0;
	}
	
	SmartPtr<IFooService> service = doGetService( "FooService", &result );
	
	if ( result == kNoError )
		service->Run();
	else
		LOG_WARN( "Failed to get service %d", result );
	
	SmartPtr<IFoo> foo = doCreateInstance( "FooFactory", &result );
	
	if ( result == kNoError )
		foo->Run();
	else
		LOG_WARN( "Failed to get service %d", result );
		
	return 0;
}